

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_totals.hpp
# Opt level: O1

Totals * __thiscall
Catch::Totals::operator-(Totals *__return_storage_ptr__,Totals *this,Totals *other)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->testCases).failedButOk = 0;
  (__return_storage_ptr__->assertions).failedButOk = 0;
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  sVar1 = (this->assertions).failed;
  sVar2 = (other->assertions).failed;
  sVar3 = (this->assertions).failedButOk;
  sVar4 = (other->assertions).failedButOk;
  (__return_storage_ptr__->assertions).passed =
       (this->assertions).passed - (other->assertions).passed;
  (__return_storage_ptr__->assertions).failed = sVar1 - sVar2;
  (__return_storage_ptr__->assertions).failedButOk = sVar3 - sVar4;
  sVar1 = (this->testCases).failed;
  sVar2 = (other->testCases).failed;
  sVar3 = (this->testCases).failedButOk;
  sVar4 = (other->testCases).failedButOk;
  (__return_storage_ptr__->testCases).passed = (this->testCases).passed - (other->testCases).passed;
  (__return_storage_ptr__->testCases).failed = sVar1 - sVar2;
  (__return_storage_ptr__->testCases).failedButOk = sVar3 - sVar4;
  return __return_storage_ptr__;
}

Assistant:

Totals operator - ( Totals const& other ) const {
            Totals diff;
            diff.assertions = assertions - other.assertions;
            diff.testCases = testCases - other.testCases;
            return diff;
        }